

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O1

string * __thiscall smf::Options::getArg_abi_cxx11_(Options *this,int index)

{
  pointer pbVar1;
  ostream *poVar2;
  
  if ((-1 < index) &&
     (pbVar1 = (this->m_argument).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     index < (int)((ulong)((long)(this->m_argument).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) >> 5)))
  {
    return pbVar1 + (uint)index;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Error: m_argument ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,index);
  poVar2 = std::operator<<(poVar2," does not exist.");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(1);
}

Assistant:

const std::string& Options::getArg(int index) {
   if (index < 0 || index >= (int)m_argument.size()) {
      std::cerr << "Error: m_argument " << index << " does not exist." << std::endl;
      exit(1);
   }
   return m_argument[index];
}